

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_EXT_texture_border_clamp(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_EXT_texture_border_clamp != 0) {
    glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)(*in_RDI)("glTexParameterIivEXT");
    glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)(*in_RDI)("glTexParameterIuivEXT");
    glad_glGetTexParameterIivEXT =
         (PFNGLGETTEXPARAMETERIIVEXTPROC)(*in_RDI)("glGetTexParameterIivEXT");
    glad_glGetTexParameterIuivEXT =
         (PFNGLGETTEXPARAMETERIUIVEXTPROC)(*in_RDI)("glGetTexParameterIuivEXT");
    glad_glSamplerParameterIivEXT =
         (PFNGLSAMPLERPARAMETERIIVEXTPROC)(*in_RDI)("glSamplerParameterIivEXT");
    glad_glSamplerParameterIuivEXT =
         (PFNGLSAMPLERPARAMETERIUIVEXTPROC)(*in_RDI)("glSamplerParameterIuivEXT");
    glad_glGetSamplerParameterIivEXT =
         (PFNGLGETSAMPLERPARAMETERIIVEXTPROC)(*in_RDI)("glGetSamplerParameterIivEXT");
    glad_glGetSamplerParameterIuivEXT =
         (PFNGLGETSAMPLERPARAMETERIUIVEXTPROC)(*in_RDI)("glGetSamplerParameterIuivEXT");
  }
  return;
}

Assistant:

static void load_GL_EXT_texture_border_clamp(GLADloadproc load) {
	if(!GLAD_GL_EXT_texture_border_clamp) return;
	glad_glTexParameterIivEXT = (PFNGLTEXPARAMETERIIVEXTPROC)load("glTexParameterIivEXT");
	glad_glTexParameterIuivEXT = (PFNGLTEXPARAMETERIUIVEXTPROC)load("glTexParameterIuivEXT");
	glad_glGetTexParameterIivEXT = (PFNGLGETTEXPARAMETERIIVEXTPROC)load("glGetTexParameterIivEXT");
	glad_glGetTexParameterIuivEXT = (PFNGLGETTEXPARAMETERIUIVEXTPROC)load("glGetTexParameterIuivEXT");
	glad_glSamplerParameterIivEXT = (PFNGLSAMPLERPARAMETERIIVEXTPROC)load("glSamplerParameterIivEXT");
	glad_glSamplerParameterIuivEXT = (PFNGLSAMPLERPARAMETERIUIVEXTPROC)load("glSamplerParameterIuivEXT");
	glad_glGetSamplerParameterIivEXT = (PFNGLGETSAMPLERPARAMETERIIVEXTPROC)load("glGetSamplerParameterIivEXT");
	glad_glGetSamplerParameterIuivEXT = (PFNGLGETSAMPLERPARAMETERIUIVEXTPROC)load("glGetSamplerParameterIuivEXT");
}